

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this)

{
  undefined8 uVar1;
  byte bVar2;
  string *psVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_168;
  byte local_121;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  char *local_c8;
  char *edit_cmd;
  string local_b8;
  allocator local_81;
  string local_80;
  string local_60 [8];
  string editCacheCommand;
  cmake *cm;
  cmGlobalUnixMakefileGenerator3 *local_18;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_18 = this;
  this_local = (cmGlobalUnixMakefileGenerator3 *)__return_storage_ptr__;
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_((string *)&cm,(cmGlobalGenerator *)this);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&cm);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    editCacheCommand.field_2._8_8_ = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar3 = cmake::GetCMakeEditCommand_abi_cxx11_((cmake *)editCacheCommand.field_2._8_8_);
    std::__cxx11::string::string(local_60,(string *)psVar3);
    uVar1 = editCacheCommand.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"CMAKE_EDIT_COMMAND",&local_81);
    pcVar4 = cmake::GetCacheDefinition((cmake *)uVar1,&local_80);
    local_121 = 1;
    if (pcVar4 != (char *)0x0) {
      local_121 = std::__cxx11::string::empty();
      local_121 = local_121 ^ 0xff;
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if ((local_121 & 1) != 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        psVar3 = cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
        std::__cxx11::string::operator=(local_60,(string *)psVar3);
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        psVar3 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
        std::__cxx11::string::operator=(local_60,(string *)psVar3);
      }
      uVar5 = std::__cxx11::string::empty();
      uVar1 = editCacheCommand.field_2._8_8_;
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b8,"CMAKE_EDIT_COMMAND",(allocator *)((long)&edit_cmd + 7));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmake::AddCacheEntry
                  ((cmake *)uVar1,&local_b8,pcVar4,"Path to cache edit program executable.",4);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&edit_cmd + 7));
      }
    }
    uVar1 = editCacheCommand.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"CMAKE_EDIT_COMMAND",&local_e9);
    pcVar4 = cmake::GetCacheDefinition((cmake *)uVar1,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_168 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      local_168 = "";
    }
    local_c8 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_168,&local_ea);
    std::allocator<char>::~allocator((allocator<char> *)&local_ea);
    std::__cxx11::string::~string(local_60);
  }
  else {
    psVar3 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if(!this->GetExtraGeneratorName().empty())
    {
    return cmSystemTools::GetCMakeGUICommand();
    }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if(!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
     !editCacheCommand.empty())
    {
    if(editCacheCommand.empty())
      {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
      }
    if(editCacheCommand.empty())
      {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
      }
    if(!editCacheCommand.empty())
      {
      cm->AddCacheEntry
        ("CMAKE_EDIT_COMMAND", editCacheCommand.c_str(),
         "Path to cache edit program executable.", cmState::INTERNAL);
      }
    }
  const char* edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd? edit_cmd : "";
}